

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

uint32 __thiscall
Js::HeapArgumentsObject::GetNextFormalArgIndex
          (HeapArgumentsObject *this,uint32 index,BOOL enumNonEnumerable,
          PropertyAttributes *attributes)

{
  BOOLEAN BVar1;
  BVSparse<Memory::Recycler> **ppBVar2;
  BVSparse<Memory::Recycler> *this_00;
  PropertyAttributes *attributes_local;
  BOOL enumNonEnumerable_local;
  uint32 index_local;
  HeapArgumentsObject *this_local;
  
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  attributes_local._4_4_ = index + 1;
  if (attributes_local._4_4_ < this->formalCount) {
    ppBVar2 = Memory::WriteBarrierPtr::operator_cast_to_BVSparse__
                        ((WriteBarrierPtr *)&this->deletedArgs);
    if (*ppBVar2 == (BVSparse<Memory::Recycler> *)0x0) {
      return attributes_local._4_4_;
    }
    for (; attributes_local._4_4_ < this->formalCount;
        attributes_local._4_4_ = attributes_local._4_4_ + 1) {
      this_00 = Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator->(&this->deletedArgs)
      ;
      BVar1 = BVSparse<Memory::Recycler>::Test(this_00,attributes_local._4_4_);
      if (BVar1 == '\0') {
        return attributes_local._4_4_;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

uint32 HeapArgumentsObject::GetNextFormalArgIndex(uint32 index, BOOL enumNonEnumerable, PropertyAttributes* attributes) const
    {
        if (attributes != nullptr)
        {
            *attributes = PropertyEnumerable;
        }

        if ( ++index < formalCount )
        {
            // None of the arguments deleted
            if ( deletedArgs == nullptr )
            {
                return index;
            }

            while ( index < formalCount )
            {
                if (!this->deletedArgs->Test(index))
                {
                    return index;
                }

                index++;
            }
        }

        return JavascriptArray::InvalidIndex;
    }